

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamahaCommands.hpp
# Opt level: O0

bool __thiscall TI::TMS::Commands::Rectangle<true,_true>::advance_pixel(Rectangle<true,_true> *this)

{
  CommandContext *pCVar1;
  bool bVar2;
  Rectangle<true,_true> *this_local;
  
  Command::advance_axis<0,true>(&this->super_Command,1);
  pCVar1 = (this->super_Command).context;
  (pCVar1->size).v[0] = (pCVar1->size).v[0] + -1;
  bVar2 = (((this->super_Command).context)->size).v[0] == 0;
  if (bVar2) {
    (((this->super_Command).context)->size).v[0] = this->width_;
    (((this->super_Command).context)->source).v[0] = this->start_x_[0];
    (((this->super_Command).context)->destination).v[0] = this->start_x_[1];
    Command::advance_axis<1,true>(&this->super_Command,1);
    pCVar1 = (this->super_Command).context;
    (pCVar1->size).v[1] = (pCVar1->size).v[1] + -1;
  }
  return bVar2;
}

Assistant:

bool advance_pixel() {
			if constexpr (logical) {
				advance_axis<0, include_source>();
				--context.size.v[0];

				if(context.size.v[0]) {
					return false;
				}
			} else {
				advance_axis<0, include_source>(mode_description.pixels_per_byte);
				context.size.v[0] -= mode_description.pixels_per_byte;

				if(context.size.v[0] & ~(mode_description.pixels_per_byte - 1)) {
					return false;
				}
			}

			context.size.v[0] = width_;
			if constexpr (include_source) {
				context.source.v[0] = start_x_[0];
			}
			context.destination.v[0] = start_x_[1];

			advance_axis<1, include_source>();
			--context.size.v[1];

			return true;
		}